

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O0

void window_make(wchar_t origin_x,wchar_t origin_y,wchar_t end_x,wchar_t end_y)

{
  undefined1 local_2c [8];
  region to_clear;
  wchar_t n;
  wchar_t end_y_local;
  wchar_t end_x_local;
  wchar_t origin_y_local;
  wchar_t origin_x_local;
  
  to_clear.col = end_x - origin_x;
  to_clear.row = end_y - origin_y;
  local_2c._0_4_ = origin_x;
  local_2c._4_4_ = origin_y;
  to_clear.page_rows = end_y;
  region_erase((region *)local_2c);
  Term_putch(origin_x,origin_y,L'\x01',L'+');
  Term_putch(end_x,origin_y,L'\x01',L'+');
  Term_putch(origin_x,to_clear.page_rows,L'\x01',L'+');
  Term_putch(end_x,to_clear.page_rows,L'\x01',L'+');
  for (to_clear.width = 1; to_clear.width < end_x - origin_x; to_clear.width = to_clear.width + 1) {
    Term_putch(origin_x + to_clear.width,origin_y,L'\x01',L'-');
    Term_putch(origin_x + to_clear.width,to_clear.page_rows,L'\x01',L'-');
  }
  for (to_clear.width = 1; to_clear.width < to_clear.page_rows - origin_y;
      to_clear.width = to_clear.width + 1) {
    Term_putch(origin_x,origin_y + to_clear.width,L'\x01',L'|');
    Term_putch(end_x,origin_y + to_clear.width,L'\x01',L'|');
  }
  return;
}

Assistant:

void window_make(int origin_x, int origin_y, int end_x, int end_y)
{
	int n;
	region to_clear;

	to_clear.col = origin_x;
	to_clear.row = origin_y;
	to_clear.width = end_x - origin_x;
	to_clear.page_rows = end_y - origin_y;

	region_erase(&to_clear);

	Term_putch(origin_x, origin_y, COLOUR_WHITE, L'+');
	Term_putch(end_x, origin_y, COLOUR_WHITE, L'+');
	Term_putch(origin_x, end_y, COLOUR_WHITE, L'+');
	Term_putch(end_x, end_y, COLOUR_WHITE, L'+');

	for (n = 1; n < (end_x - origin_x); n++) {
		Term_putch(origin_x + n, origin_y, COLOUR_WHITE, L'-');
		Term_putch(origin_x + n, end_y, COLOUR_WHITE, L'-');
	}

	for (n = 1; n < (end_y - origin_y); n++) {
		Term_putch(origin_x, origin_y + n, COLOUR_WHITE, L'|');
		Term_putch(end_x, origin_y + n, COLOUR_WHITE, L'|');
	}
}